

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btQuantizedBvh.cpp
# Opt level: O3

void __thiscall btQuantizedBvh::btQuantizedBvh(btQuantizedBvh *this)

{
  this->_vptr_btQuantizedBvh = (_func_int **)&PTR__btQuantizedBvh_0021b670;
  this->m_bulletVersion = 0x11c;
  this->m_useQuantization = false;
  (this->m_leafNodes).m_ownsMemory = true;
  (this->m_leafNodes).m_data = (btOptimizedBvhNode *)0x0;
  (this->m_leafNodes).m_size = 0;
  (this->m_leafNodes).m_capacity = 0;
  (this->m_contiguousNodes).m_ownsMemory = true;
  (this->m_contiguousNodes).m_data = (btOptimizedBvhNode *)0x0;
  (this->m_contiguousNodes).m_size = 0;
  (this->m_contiguousNodes).m_capacity = 0;
  (this->m_quantizedLeafNodes).m_ownsMemory = true;
  (this->m_quantizedLeafNodes).m_data = (btQuantizedBvhNode *)0x0;
  (this->m_quantizedLeafNodes).m_size = 0;
  (this->m_quantizedLeafNodes).m_capacity = 0;
  (this->m_quantizedContiguousNodes).m_ownsMemory = true;
  (this->m_quantizedContiguousNodes).m_data = (btQuantizedBvhNode *)0x0;
  (this->m_quantizedContiguousNodes).m_size = 0;
  (this->m_quantizedContiguousNodes).m_capacity = 0;
  this->m_traversalMode = TRAVERSAL_STACKLESS;
  (this->m_SubtreeHeaders).m_ownsMemory = true;
  (this->m_SubtreeHeaders).m_data = (btBvhSubtreeInfo *)0x0;
  (this->m_SubtreeHeaders).m_size = 0;
  (this->m_SubtreeHeaders).m_capacity = 0;
  this->m_subtreeHeaderCount = 0;
  (this->m_bvhAabbMin).m_floats[0] = -3.4028235e+38;
  (this->m_bvhAabbMin).m_floats[1] = -3.4028235e+38;
  (this->m_bvhAabbMin).m_floats[2] = -3.4028235e+38;
  (this->m_bvhAabbMin).m_floats[3] = 0.0;
  (this->m_bvhAabbMax).m_floats[0] = 3.4028235e+38;
  (this->m_bvhAabbMax).m_floats[1] = 3.4028235e+38;
  (this->m_bvhAabbMax).m_floats[2] = 3.4028235e+38;
  (this->m_bvhAabbMax).m_floats[3] = 0.0;
  return;
}

Assistant:

btQuantizedBvh::btQuantizedBvh() : 
					m_bulletVersion(BT_BULLET_VERSION),
					m_useQuantization(false), 
					//m_traversalMode(TRAVERSAL_STACKLESS_CACHE_FRIENDLY)
					m_traversalMode(TRAVERSAL_STACKLESS)
					//m_traversalMode(TRAVERSAL_RECURSIVE)
					,m_subtreeHeaderCount(0) //PCK: add this line
{
	m_bvhAabbMin.setValue(-SIMD_INFINITY,-SIMD_INFINITY,-SIMD_INFINITY);
	m_bvhAabbMax.setValue(SIMD_INFINITY,SIMD_INFINITY,SIMD_INFINITY);
}